

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
          (Scanner<UTF8EncodingPolicyBase<false>> *this,OLECHAR delim,EncodedCharPtr *pp)

{
  TemporaryBuffer *this_00;
  byte bVar1;
  byte *pbVar2;
  byte *end;
  Token *pTVar3;
  code *pcVar4;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSVar5;
  char16 cVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  IdentPtr pIVar9;
  uint32 cch;
  ushort uVar10;
  uint ch_00;
  EncodedCharPtr s_1;
  HRESULT hr;
  undefined1 (*prgch) [16];
  int iVar11;
  EncodedCharPtr s;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  char16 local_52;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSStack_50;
  OLECHAR lower;
  uint local_44;
  byte *pbStack_40;
  int wT;
  char16 local_32 [4];
  OLECHAR ch;
  
  pbVar2 = *pp;
  end = *(byte **)(this + 0x4c8);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xf3);
  *(undefined4 *)(this + 0x51c) = 0;
  this_00 = (TemporaryBuffer *)(this + 0x628);
  *(undefined4 *)(this + 0x634) = 0;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pbStack_40 = pbVar2;
  pSStack_50 = (Scanner<UTF8EncodingPolicyBase<false>_> *)this;
LAB_00f03910:
  pSVar5 = pSStack_50;
  pbVar2 = pbStack_40 + 1;
  if (end <= pbStack_40) {
    local_32[0] = L'\0';
LAB_00f03951:
    if (end < pbVar2) {
      pSStack_50->m_currentCharacter = pbStack_40;
      pbStack_40 = pbVar2;
      Scanner<UTF8EncodingPolicyBase<false>_>::Error(pSStack_50,-0x7ff5fc09);
    }
    uVar13 = 0;
    cVar6 = L'\0';
    goto LAB_00f0395f;
  }
  bVar1 = *pbStack_40;
  uVar13 = (uint)bVar1;
  local_32[0] = (char16)bVar1;
  if (bVar1 < 0x24) {
    if (bVar1 < 0xd) {
      if (bVar1 == 0) goto LAB_00f03951;
      pbStack_40 = pbVar2;
      if (bVar1 == 10) goto LAB_00f03a9b;
    }
    else {
      if (bVar1 == 0xd) {
        if ((pbVar2 < end) && (*pbVar2 == 10)) {
          pbVar2 = pbStack_40 + 2;
        }
        pbStack_40 = pbVar2;
        local_32[0] = L'\n';
LAB_00f03a9b:
        pSStack_50->m_line = pSStack_50->m_line + 1;
        pSStack_50->m_pchPrevLine = pSStack_50->m_pchMinLine;
        pSStack_50->m_cMinLineMultiUnits =
             (pSStack_50->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
        pSStack_50->m_pchMinLine = pbStack_40;
        uVar13 = 10;
        cVar6 = L'\n';
        pbVar2 = pbStack_40;
        goto LAB_00f0395f;
      }
      if (bVar1 == 0x22) {
LAB_00f039ac:
        cVar6 = (char16)bVar1;
        pbStack_40 = pbVar2;
        if (local_32[0] != delim) goto LAB_00f0395f;
        goto LAB_00f03f88;
      }
    }
LAB_00f03ad9:
    pbStack_40 = pbVar2;
    if ((char)bVar1 < '\0') {
      cVar6 = utf8::DecodeTail((ushort)bVar1,&stack0xffffffffffffffc0,end,
                               (DecodeOptions *)(this + 0x10),(bool *)0x0);
      (pSStack_50->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
           (size_t)(pbStack_40 +
                   ((pSStack_50->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits - (long)pbVar2))
      ;
      uVar13 = (uint)(ushort)cVar6;
      pbVar2 = pbStack_40;
      local_32[0] = cVar6;
    }
    else {
LAB_00f03ade:
      cVar6 = (char16)uVar13;
      pbVar2 = pbStack_40;
    }
    goto LAB_00f0395f;
  }
  if (bVar1 < 0x5c) {
    if (bVar1 != 0x24) {
      if (bVar1 == 0x27) goto LAB_00f039ac;
      goto LAB_00f03ad9;
    }
    uVar13 = 0x24;
    if (pbVar2 < end) {
      cVar6 = L'$';
      if (*pbVar2 != 0x7b) goto LAB_00f0395f;
      goto LAB_00f03f88;
    }
    cVar6 = L'$';
    goto LAB_00f0395f;
  }
  if (bVar1 == 0x5c) {
    pbStack_40 = pbVar2;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,0x5c);
    pSStack_50->field_0x508 = pSStack_50->field_0x508 | 8;
    pbVar2 = pbStack_40 + 1;
    if (end <= pbStack_40) {
      local_32[0] = L'\0';
LAB_00f03a7c:
      if (end <= pbVar2) {
        hr = -0x7ff5fc09;
        pbStack_40 = pbVar2;
        goto LAB_00f04089;
      }
      cVar6 = L'0';
      uVar13 = 0;
      goto LAB_00f0395f;
    }
    bVar1 = *pbStack_40;
    uVar13 = (uint)bVar1;
    local_32[0] = (char16)bVar1;
    uVar12 = (uint)bVar1;
    if (0x61 < bVar1) {
      switch(bVar1) {
      case 0x6e:
        local_32[0] = L'\n';
        cVar6 = L'n';
        uVar13 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
switchD_00f03a20_caseD_6f:
        pbStack_40 = pbVar2;
        if ((char)bVar1 < '\0') {
          cVar6 = utf8::DecodeTail((ushort)bVar1,&stack0xffffffffffffffc0,end,
                                   (DecodeOptions *)(this + 0x10),(bool *)0x0);
          uVar13 = (uint)(ushort)cVar6;
          (pSStack_50->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
               (size_t)(pbStack_40 +
                       ((pSStack_50->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits -
                       (long)pbVar2));
          pbVar2 = pbStack_40;
          local_32[0] = cVar6;
          if ((uVar13 & 0xfffe) == 0x2028) goto LAB_00f03e24;
          break;
        }
        goto LAB_00f03ade;
      case 0x72:
        local_32[0] = L'\r';
        cVar6 = L'r';
        uVar13 = 0xd;
        break;
      case 0x74:
        local_32[0] = L'\t';
        cVar6 = L't';
        uVar13 = 9;
        break;
      case 0x75:
        pbStack_40 = pbVar2;
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,0x75);
        local_32[0] = L'\0';
        if (pbStack_40 < end) {
          bVar1 = *pbStack_40;
          uVar10 = (ushort)bVar1;
          pbStack_40 = pbStack_40 + 1;
          BVar7 = Js::NumberUtilities::FHexDigit((ushort)bVar1,(int *)&local_44);
          if (BVar7 == 0) {
            hr = -0x7ff5fc01;
            if ((bVar1 == 0x7b) && (pSStack_50->es6UnicodeMode == true)) {
              Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,0x7b)
              ;
              if (pbStack_40 < end) {
                cVar6 = (char16)*pbStack_40;
              }
              else {
                cVar6 = L'\0';
              }
              pbStack_40 = pbStack_40 + 1;
              BVar7 = Js::NumberUtilities::FHexDigit(cVar6,(int *)&local_44);
              hr = -0x7ff5fc01;
              if (BVar7 != 0) {
                Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                          (this_00,(uint)(ushort)cVar6);
                uVar13 = local_44;
                do {
                  if (pbStack_40 < end) {
                    bVar1 = *pbStack_40;
                    ch_00 = (uint)bVar1;
                    pbStack_40 = pbStack_40 + 1;
                    BVar7 = Js::NumberUtilities::FHexDigit((ushort)bVar1,(int *)&local_44);
                    if (BVar7 == 0) goto LAB_00f03ee5;
                  }
                  else {
                    ch_00 = 0;
                    pbStack_40 = pbStack_40 + 1;
                    BVar7 = Js::NumberUtilities::FHexDigit(L'\0',(int *)&local_44);
                    if (BVar7 == 0) goto LAB_00f0407d;
                  }
                  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                            (this_00,ch_00);
                  uVar13 = uVar13 * 0x10 + local_44;
                  if (0x10ffff < uVar13) {
                    hr = -0x7ff5fbd9;
                    break;
                  }
                } while( true );
              }
            }
            goto LAB_00f04089;
          }
LAB_00f03ce7:
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                    (this_00,(uint)uVar10);
          uVar13 = local_44;
          if (pbStack_40 < end) {
            cVar6 = (char16)*pbStack_40;
          }
          else {
            cVar6 = L'\0';
          }
          pbStack_40 = pbStack_40 + 1;
          BVar7 = Js::NumberUtilities::FHexDigit(cVar6,(int *)&local_44);
          if (BVar7 != 0) {
            Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                      (this_00,(uint)(ushort)cVar6);
            iVar11 = local_44 * 0x100 + uVar13 * 0x1000;
            goto LAB_00f03d3c;
          }
        }
        else {
          uVar10 = 0;
          pbStack_40 = pbStack_40 + 1;
          BVar7 = Js::NumberUtilities::FHexDigit(L'\0',(int *)&local_44);
          if (BVar7 != 0) goto LAB_00f03ce7;
        }
        goto LAB_00f04084;
      case 0x76:
        local_32[0] = L'\v';
        cVar6 = L'v';
        uVar13 = 0xb;
        break;
      case 0x78:
        pbStack_40 = pbVar2;
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,0x78);
        local_32[0] = L'\0';
        iVar11 = 0;
LAB_00f03d3c:
        if (pbStack_40 < end) {
          cVar6 = (char16)*pbStack_40;
        }
        else {
          cVar6 = L'\0';
        }
        pbStack_40 = pbStack_40 + 1;
        BVar7 = Js::NumberUtilities::FHexDigit(cVar6,(int *)&local_44);
        if (BVar7 != 0) {
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                    (this_00,(uint)(ushort)cVar6);
          uVar13 = local_44;
          if (pbStack_40 < end) {
            cVar6 = (char16)*pbStack_40;
          }
          else {
            cVar6 = L'\0';
          }
          pbStack_40 = pbStack_40 + 1;
          BVar7 = Js::NumberUtilities::FHexDigit(cVar6,(int *)&local_44);
          if (BVar7 != 0) {
            uVar13 = uVar13 * 0x10 + iVar11 + local_44;
            hr = -0x7ff5fc01;
            if (0xffff < uVar13) goto LAB_00f04089;
            local_32[0] = (char16)uVar13;
            pbVar2 = pbStack_40;
            break;
          }
        }
LAB_00f04084:
        hr = -0x7ff5fc01;
        goto LAB_00f04089;
      default:
        if (uVar12 == 0x66) {
          local_32[0] = L'\f';
          cVar6 = L'f';
          uVar13 = 0xc;
        }
        else {
          if (uVar12 != 0x62) goto switchD_00f03a20_caseD_6f;
          local_32[0] = L'\b';
          cVar6 = L'b';
          uVar13 = 8;
        }
      }
      goto LAB_00f0395f;
    }
    if (0x2f < bVar1) {
      hr = -0x7ff5fbf1;
      if (3 < bVar1 - 0x30) {
        pbStack_40 = pbVar2;
        if (uVar12 - 0x34 < 4) goto LAB_00f04089;
        goto switchD_00f03a20_caseD_6f;
      }
      local_32[0] = local_32[0] + L'￐';
      if (pbVar2 < end) {
        bVar14 = (*pbVar2 & 0xf8) == 0x30;
      }
      else {
        bVar14 = false;
      }
      pbStack_40 = pbVar2;
      if ((local_32[0] != L'\0') || (bVar14)) goto LAB_00f04089;
      uVar13 = 0;
      cVar6 = L'0';
      local_32[0] = L'\0';
      goto LAB_00f0395f;
    }
    if (bVar1 == 0) goto LAB_00f03a7c;
    cVar6 = L'\n';
    if (uVar12 != 10) {
      if (uVar12 != 0xd) goto switchD_00f03a20_caseD_6f;
      if ((pbVar2 < end) && (*pbVar2 == 10)) {
        pbVar2 = pbStack_40 + 2;
      }
    }
LAB_00f03e24:
    pbStack_40 = pbVar2;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
              (this_00,(uint)(ushort)cVar6);
    pSStack_50->m_line = pSStack_50->m_line + 1;
    pSStack_50->m_pchPrevLine = pSStack_50->m_pchMinLine;
    pSStack_50->m_cMinLineMultiUnits =
         (pSStack_50->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    pSStack_50->m_pchMinLine = pbStack_40;
    goto LAB_00f03910;
  }
  if (bVar1 != 0x60) goto LAB_00f03ad9;
LAB_00f03f88:
  if ((pSStack_50->field_0x508 & 0x40) == 0) {
    prgch = (undefined1 (*) [16])(pSStack_50->m_tempChBuf).m_prgch;
    cch = (pSStack_50->m_tempChBuf).m_ichCur;
  }
  else {
    if (((pSStack_50->m_tempChBuf).m_ichCur != 10) ||
       (prgch = (undefined1 (*) [16])(pSStack_50->m_tempChBuf).m_prgch,
       *prgch != _DAT_011b2890 || ZEXT416(*(uint *)prgch[1]) != _DAT_011b2880)) {
      pTVar3 = pSStack_50->m_ptoken;
      *(double *)&pTVar3->u = 0.0;
      *(bool *)((long)&pTVar3->u + 8) = false;
      *(undefined7 *)((long)&pTVar3->u + 9) = 0;
      goto LAB_00f0400d;
    }
    cch = 10;
  }
  pTVar3 = pSStack_50->m_ptoken;
  pIVar9 = HashTbl::PidHashNameLen<char16_t>(&pSStack_50->m_htbl,(char16_t *)prgch,cch);
  (pTVar3->u).field_0.pid = pIVar9;
  (pTVar3->u).field_0.pchMin = (char *)0x0;
LAB_00f0400d:
  pSVar5->m_scanState = ScanStateNormal;
  pSVar5->field_0x508 = pSVar5->field_0x508 & 0xfd | (delim == L'\"') * '\x02';
  *pp = pbStack_40;
  return tkStrCon;
LAB_00f03ee5:
  if (bVar1 != 0x7d) {
LAB_00f0407d:
    hr = -0x7ff5fbd8;
LAB_00f04089:
    pSStack_50->m_currentCharacter = pbStack_40 + -1;
    Scanner<UTF8EncodingPolicyBase<false>_>::Error(pSStack_50,hr);
  }
  if (uVar13 < 0x110000) {
    if (uVar13 < 0x10000) {
      local_32[0] = (char16)uVar13;
      cVar6 = L'}';
      pbVar2 = pbStack_40;
      goto LAB_00f0395f;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                        ,0x4bd,"(codePoint <= 0x10FFFF)","codePoint <= 0x10FFFF");
    if (!bVar14) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  local_52 = L'\0';
  Js::NumberUtilities::CodePointAsSurrogatePair(uVar13,&local_52,local_32);
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
            ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_52);
  cVar6 = L'}';
  uVar13 = (uint)(ushort)local_32[0];
  pbVar2 = pbStack_40;
LAB_00f0395f:
  pbStack_40 = pbVar2;
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
            ((TemporaryBuffer *)(this + 0x510),uVar13 & 0xffff);
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
            (this_00,(uint)(ushort)cVar6);
  goto LAB_00f03910;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringConstant(OLECHAR delim, EncodedCharPtr *pp)
{
    static_assert((stringTemplateMode && createRawString) || (!stringTemplateMode && !createRawString), "stringTemplateMode and createRawString must have the same value");

    OLECHAR ch, c, rawch;
    int wT;
    EncodedCharPtr p = *pp;
    EncodedCharPtr last = m_pchLast;

    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = FALSE;

    m_tempChBuf.Reset();

    // Use template parameter to gate raw string creation.
    // If createRawString is false, all these operations should be no-ops
    if (createRawString)
    {
        m_tempChBufSecondary.Reset();
    }

    for (;;)
    {
        switch ((rawch = ch = this->ReadFirst(p, last)))
        {
        case kchRET:
            if (stringTemplateMode)
            {
                if (this->PeekFirst(p, last) == kchNWL)
                {
                    // Eat the <LF> char, ignore return
                    this->ReadFirst(p, last);
                }

                // Both <CR> and <CR><LF> are normalized to <LF> in template cooked and raw values
                ch = rawch = kchNWL;
            }

            // Fall through
        case kchNWL:
            if (stringTemplateMode)
            {
                // Notify the scanner to update current line, number of lines etc
                NotifyScannedNewLine();

                // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                m_pchMinLine = p;

                break;
            }

            m_currentCharacter = p - 1;
            Error(ERRnoStrEnd);

        case '"':
        case '\'':
            if (ch == delim)
                goto LBreak;
            break;

        case '`':
            // In string template scan mode, don't consume the '`' - we need to differentiate
            // between a closed string template and the expression open sequence - ${
            if (stringTemplateMode)
            {
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case '$':
            // If we are parsing a string literal part of a string template, ${ indicates we need to switch
            // to parsing an expression.
            if (stringTemplateMode && this->PeekFirst(p, last) == '{')
            {
                // Rewind to the $ and return
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case kchNUL:
            if (p > last)
            {
                m_currentCharacter = p - 1;
                Error(ERRnoStrEnd);
            }
            break;

        default:
LMainDefault:
            if (this->IsMultiUnitChar(ch))
            {
                rawch = ch = this->template ReadRest<true>(ch, p, last);
            }
            break;

        case kchBSL:
            // In raw mode '\\' is not an escape character, just add the char into the raw buffer.
            m_tempChBufSecondary.template AppendCh<createRawString>(ch);

            m_EscapeOnLastTkStrCon=TRUE;

            // In raw mode, we append the raw char itself and not the escaped value so save the char.
            rawch = ch = this->ReadFirst(p, last);
            codepoint_t codePoint = 0;
            uint errorType = (uint)ERRbadHexDigit;
            switch (ch)
            {
            case 'b':
                ch = 0x08;
                break;
            case 't':
                ch = 0x09;
                break;
            case 'v':
                ch = 0x0B; //Only in ES5 mode
                break; //same as default
            case 'n':
                ch = 0x0A;
                break;
            case 'f':
                ch = 0x0C;
                break;
            case 'r':
                ch = 0x0D;
                break;
            case 'x':
                // Insert the 'x' here before jumping to parse the hex digits.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                // 2 hex digits
                ch = 0;
                goto LTwoHex;
            case 'u':
                // Raw string just inserts a 'u' here.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                ch = 0;
                if (Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto LFourHex;
                else if (c != '{' || !this->es6UnicodeMode)
                    goto ReturnScanError;

                Assert(c == '{');
                // c should definitely be a '{' which should be appended to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                //At least one digit is expected
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    goto ReturnScanError;
                }

                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint = static_cast<codepoint_t>(wT);

                while(Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    m_tempChBufSecondary.template AppendCh<createRawString>(c);
                    codePoint <<= 4;
                    codePoint += static_cast<codepoint_t>(wT);

                    if (codePoint > 0x10FFFF)
                    {
                        errorType = (uint)ERRInvalidCodePoint;
                        goto ReturnScanError;
                    }
                }

                if (c != '}')
                {
                    errorType = (uint)ERRMissingCurlyBrace;
                    goto ReturnScanError;
                }

                Assert(codePoint <= 0x10FFFF);

                if (codePoint >= 0x10000)
                {
                    OLECHAR lower = 0;
                    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &ch);
                    m_tempChBuf.AppendCh(lower);
                }
                else
                {
                    ch = (char16)codePoint;
                }

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                break;
LFourHex:
                codePoint = 0x0;
                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x1000);
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append fourth (or second) hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0100);

LTwoHex:
                // This code path doesn't expect curly.
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0010);

                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                codePoint += static_cast<codepoint_t>(wT);

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                if (codePoint < 0x10000)
                {
                    ch = static_cast<OLECHAR>(codePoint);
                }
                else
                {
                    goto ReturnScanError;
                }
                break;
            case '0':
            case '1':
            case '2':
            case '3':
                // 1 to 3 octal digits

                ch -= '0';

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    c = this->PeekFirst(p, last);
                    if (ch != 0 || (c >= '0' && c <= '7'))
                    {
                        errorType = (uint)ERRES5NoOctal;
                        goto ReturnScanError;
                    }
                    break;
                }

                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    if (ch != 0 || ((char16)wT <= 9))
                    {
                        m_OctOrLeadingZeroOnLastTKNumber = true;
                    }
                    p--;
                    break;
                }

                m_OctOrLeadingZeroOnLastTKNumber = true;
                ch = static_cast< OLECHAR >(ch * 8 + wT);
                goto LOneOctal;
            case '4':
            case '5':
            case '6':
            case '7':
                // 1 to 2 octal digits

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    errorType = (uint)ERRES5NoOctal;
                    goto ReturnScanError;
                }

                ch -= '0';

                m_OctOrLeadingZeroOnLastTKNumber = true;

LOneOctal:
                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    p--;
                    break;
                }

                ch = static_cast< OLECHAR >(ch * 8 + wT);
                break;

            case kchRET:        // 0xD
                if (stringTemplateMode)
                {
                    // If this is \<CR><LF> we can eat the <LF> right now
                    if (this->PeekFirst(p, last) == kchNWL)
                    {
                        // Eat the <LF> char, ignore return
                        this->ReadFirst(p, last);
                    }

                    // Both \<CR> and \<CR><LF> are normalized to \<LF> in template raw string
                    rawch = kchNWL;
                }
            case kchLS:         // 0x2028, classifies as new line
            case kchPS:         // 0x2029, classifies as new line
            case kchNWL:        // 0xA
LEcmaEscapeLineBreak:
                if (stringTemplateMode)
                {
                    // We're going to ignore the line continuation tokens for the cooked strings, but we need to append the token for raw strings
                    m_tempChBufSecondary.template AppendCh<createRawString>(rawch);

                    // Template literal strings ignore all escaped line continuation tokens
                    NotifyScannedNewLine();

                    // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                    m_pchMinLine = p;

                    continue;
                }

                m_currentCharacter = p;
                ScanNewLine(ch);
                p = m_currentCharacter;
                continue;

            case 0:
                if (p >= last)
                {
                    errorType = (uint)ERRnoStrEnd;

ReturnScanError:
                    m_currentCharacter = p - 1;
                    Error(errorType);
                }
                else if (stringTemplateMode)
                {
                    // Escaped null character is translated into 0x0030 for raw template literals
                    rawch = 0x0030;
                }
                break;

            default:
                if (this->IsMultiUnitChar(ch))
                {
                    rawch = ch = this->template ReadRest<true>(ch, p, last);
                    switch (ch)
                    {
                    case kchLS:
                    case kchPS:
                        goto LEcmaEscapeLineBreak;
                    }
                }
                break;
            }
            break;
        }

        m_tempChBuf.AppendCh(ch);
        m_tempChBufSecondary.template AppendCh<createRawString>(rawch);
    }

LBreak:
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;

        if ((m_tempChBuf.m_ichCur == 10) && (0 == memcmp(_u("use strict"), m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur * sizeof(OLECHAR))))
        {
            createPid = true;
        }
    }

    if (createPid)
    {
        m_ptoken->SetIdentifier(this->GetHashTbl()->PidHashNameLen(m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur));
    }
    else
    {
        m_ptoken->SetIdentifier(NULL);
    }

    m_scanState = ScanStateNormal;
    m_doubleQuoteOnLastTkStrCon = '"' == delim;
    *pp = p;

    return tkStrCon;
}